

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

void __thiscall duckdb::StringValueScanner::FinalizeChunkProcess(StringValueScanner *this)

{
  StringValueResult *result;
  LineError *this_00;
  idx_t *piVar1;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_01;
  int64_t *piVar2;
  CSVState CVar3;
  idx_t iVar4;
  bool bVar5;
  bool bVar6;
  undefined8 in_RAX;
  CSVFileScan *pCVar7;
  CSVBufferHandle *pCVar8;
  CSVStateMachine *pCVar9;
  ulong uVar10;
  undefined7 uStack_38;
  CSVErrorType type;
  
  if (((this->result).super_ScannerResult.result_size <= (ulong)(this->result).number_of_rows) ||
     ((this->super_BaseScanner).iterator.done == true)) {
    if ((this->super_BaseScanner).sniffing != false) {
      return;
    }
    if ((this->super_BaseScanner).csv_file_scan.internal.
        super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      return;
    }
    iVar4 = (this->super_BaseScanner).bytes_read;
    pCVar7 = shared_ptr<duckdb::CSVFileScan,_true>::operator->
                       (&(this->super_BaseScanner).csv_file_scan);
    LOCK();
    (pCVar7->bytes_read).super___atomic_base<unsigned_long>._M_i =
         (pCVar7->bytes_read).super___atomic_base<unsigned_long>._M_i + iVar4;
    UNLOCK();
    (this->super_BaseScanner).bytes_read = 0;
    return;
  }
  result = &this->result;
  if ((this->super_BaseScanner).iterator.is_set == false) {
    while ((bVar5 = BaseScanner::FinishedFile(&this->super_BaseScanner), !bVar5 &&
           ((ulong)(this->result).number_of_rows < (this->result).super_ScannerResult.result_size)))
    {
      MoveToNextBuffer(this);
      if ((this->result).super_ScannerResult.result_size <= (ulong)(this->result).number_of_rows) {
        return;
      }
      if ((this->super_BaseScanner).cur_buffer_handle.internal.
          super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        BaseScanner::Process<duckdb::StringValueResult>(&this->super_BaseScanner,result);
      }
    }
    bVar5 = BaseScanner::FinishedFile(&this->super_BaseScanner);
    (this->super_BaseScanner).iterator.done = bVar5;
    if ((this->result).null_padding != true) {
      return;
    }
    if (0x7ff < (this->result).number_of_rows) {
      return;
    }
    uVar10 = (this->result).chunk_col_id;
    if (uVar10 == 0) {
      return;
    }
    while (uVar10 < (ulong)(((long)*(pointer *)
                                    ((long)&(this->result).parse_chunk.data.
                                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                            .
                                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                            (long)(this->result).parse_chunk.data.
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x68)) {
      (this->result).chunk_col_id = uVar10 + 1;
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(this->result).validity_mask.
                  super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                  super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10]->
                  super_TemplatedValidityMask<unsigned_long>,(this->result).number_of_rows);
      piVar1 = &(this->result).cur_col_id;
      *piVar1 = *piVar1 + 1;
      uVar10 = (this->result).chunk_col_id;
    }
    piVar2 = &(this->result).number_of_rows;
    *piVar2 = *piVar2 + 1;
    return;
  }
  this_00 = &(this->result).current_errors;
  _uStack_38 = in_RAX;
  bVar5 = LineError::HasErrorType(this_00,UNTERMINATED_QUOTES);
  if ((bVar5) || (bVar5 = LineError::HasErrorType(this_00,INVALID_STATE), bVar5)) {
    bVar5 = LineError::HasErrorType(this_00,UNTERMINATED_QUOTES);
    if (bVar5) {
      _uStack_38 = CONCAT17(4,uStack_38);
    }
    else {
      _uStack_38 = CONCAT17(9,uStack_38);
    }
    bVar5 = true;
  }
  else {
    (this->super_BaseScanner).iterator.done = true;
    bVar5 = false;
  }
  if ((this->super_BaseScanner).cur_buffer_handle.internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    return;
  }
  bVar6 = MoveToNextBuffer(this);
  if ((this->super_BaseScanner).cur_buffer_handle.internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_01 = &(this->super_BaseScanner).cur_buffer_handle;
    if (!bVar6 || (this->result).cur_col_id != 0 && bVar6) {
      ProcessExtraRow(this);
    }
    pCVar8 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01);
    if ((pCVar8->is_last_buffer == true) &&
       (uVar10 = (this->super_BaseScanner).iterator.pos.buffer_pos,
       pCVar8 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_01),
       pCVar8->actual_size <= uVar10)) {
      MoveToNextBuffer(this);
    }
  }
  bVar6 = LineError::HasErrorType(this_00,UNTERMINATED_QUOTES);
  if (bVar6) {
    _uStack_38 = CONCAT17(4,uStack_38);
  }
  else {
    bVar6 = LineError::HasErrorType(this_00,INVALID_STATE);
    if (!bVar6) goto LAB_0189a25f;
    _uStack_38 = CONCAT17(9,uStack_38);
  }
  bVar5 = true;
LAB_0189a25f:
  bVar6 = LineError::HandleErrors(this_00,result);
  if (bVar6) {
    piVar2 = &(this->result).number_of_rows;
    *piVar2 = *piVar2 + 1;
  }
  CVar3 = (this->super_BaseScanner).states.states[1];
  if ((!bVar5 && (CVar3 == QUOTED_NEW_LINE || CVar3 == QUOTED)) &&
     (pCVar9 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                         (&(this->super_BaseScanner).state_machine),
     (pCVar9->dialect_options).state_machine_options.strict_mode.value == true)) {
    _uStack_38 = CONCAT17(4,uStack_38);
    LineError::Insert(this_00,&type,&(this->result).cur_col_id,&(this->result).chunk_col_id,
                      &(this->result).super_ScannerResult.last_position,0);
    bVar5 = LineError::HandleErrors(this_00,result);
    if (bVar5) {
      piVar2 = &(this->result).number_of_rows;
      *piVar2 = *piVar2 + 1;
    }
  }
  if (((this->super_BaseScanner).iterator.done == false) &&
     (((this->super_BaseScanner).iterator.boundary.end_pos <=
       (this->super_BaseScanner).iterator.pos.buffer_pos ||
      (bVar5 = BaseScanner::FinishedFile(&this->super_BaseScanner), bVar5)))) {
    (this->super_BaseScanner).iterator.done = true;
  }
  return;
}

Assistant:

void StringValueScanner::FinalizeChunkProcess() {
	if (static_cast<idx_t>(result.number_of_rows) >= result.result_size || iterator.done) {
		// We are done
		if (!sniffing) {
			if (csv_file_scan) {
				csv_file_scan->bytes_read += bytes_read;
				bytes_read = 0;
			}
		}
		return;
	}
	// If we are not done we have two options.
	// 1) If a boundary is set.
	if (iterator.IsBoundarySet()) {
		bool found_error = false;
		CSVErrorType type;
		if (!result.current_errors.HasErrorType(UNTERMINATED_QUOTES) &&
		    !result.current_errors.HasErrorType(INVALID_STATE)) {
			iterator.done = true;
		} else {
			found_error = true;
			if (result.current_errors.HasErrorType(UNTERMINATED_QUOTES)) {
				type = UNTERMINATED_QUOTES;
			} else {
				type = INVALID_STATE;
			}
		}
		// We read until the next line or until we have nothing else to read.
		// Move to next buffer
		if (!cur_buffer_handle) {
			return;
		}
		bool moved = MoveToNextBuffer();
		if (cur_buffer_handle) {
			if (moved && result.cur_col_id > 0) {
				ProcessExtraRow();
			} else if (!moved) {
				ProcessExtraRow();
			}
			if (cur_buffer_handle->is_last_buffer && iterator.pos.buffer_pos >= cur_buffer_handle->actual_size) {
				MoveToNextBuffer();
			}
		}
		if (result.current_errors.HasErrorType(UNTERMINATED_QUOTES)) {
			found_error = true;
			type = UNTERMINATED_QUOTES;
		} else if (result.current_errors.HasErrorType(INVALID_STATE)) {
			found_error = true;
			type = INVALID_STATE;
		}
		if (result.current_errors.HandleErrors(result)) {
			result.number_of_rows++;
		}
		if (states.IsQuotedCurrent() && !found_error &&
		    state_machine->dialect_options.state_machine_options.strict_mode.GetValue()) {
			type = UNTERMINATED_QUOTES;
			// If we finish the execution of a buffer, and we end in a quoted state, it means we have unterminated
			// quotes
			result.current_errors.Insert(type, result.cur_col_id, result.chunk_col_id, result.last_position);
			if (result.current_errors.HandleErrors(result)) {
				result.number_of_rows++;
			}
		}
		if (!iterator.done) {
			if (iterator.pos.buffer_pos >= iterator.GetEndPos() || iterator.pos.buffer_idx > iterator.GetBufferIdx() ||
			    FinishedFile()) {
				iterator.done = true;
			}
		}
	} else {
		// 2) If a boundary is not set
		// We read until the chunk is complete, or we have nothing else to read.
		while (!FinishedFile() && static_cast<idx_t>(result.number_of_rows) < result.result_size) {
			MoveToNextBuffer();
			if (static_cast<idx_t>(result.number_of_rows) >= result.result_size) {
				return;
			}
			if (cur_buffer_handle) {
				Process(result);
			}
		}
		iterator.done = FinishedFile();
		if (result.null_padding && result.number_of_rows < STANDARD_VECTOR_SIZE && result.chunk_col_id > 0) {
			while (result.chunk_col_id < result.parse_chunk.ColumnCount()) {
				result.validity_mask[result.chunk_col_id++]->SetInvalid(static_cast<idx_t>(result.number_of_rows));
				result.cur_col_id++;
			}
			result.number_of_rows++;
		}
	}
}